

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValueShrinkableStorage.hpp
# Opt level: O1

KeyIndexStorage * __thiscall
supermap::
KeyValueShrinkableStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
::shrink(KeyIndexStorage *__return_storage_ptr__,
        KeyValueShrinkableStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
        *this,unsigned_long shrinkBatchSize,string *newIndexFileName)

{
  size_type *psVar1;
  ulong uVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  element_type *peVar4;
  pointer pcVar5;
  bool bVar6;
  _Alloc_hider _Var7;
  KeyValueShrinkableStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
  *this_00;
  KeyIndexStorage *this_01;
  char cVar8;
  ulong uVar9;
  undefined8 *puVar10;
  ulong uVar11;
  char cVar12;
  undefined8 uVar13;
  size_type __n;
  string batchFileName;
  vector<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>_>_>
  notSortedKeys;
  string shrinkFilenamePrefix;
  string tempSortedIndexFilename;
  KeyIndexStorage actualExportedKeys;
  vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
  tempFilesLock;
  InputIterator<supermap::StorageValueIgnorer<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_7UL,_void>
  notSortedKeysStream;
  KeyIndexStorage exportedKeys;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
  sortedBatches;
  string local_2b8;
  string local_298;
  unsigned_long local_278;
  KeyValueShrinkableStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
  *local_270;
  long *local_268;
  long local_260;
  long local_258 [2];
  string local_248;
  KeyIndexStorage *local_228;
  undefined1 local_220 [24];
  _Head_base<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_*,_false>
  local_208;
  element_type *local_200;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f8;
  _Head_base<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_void>_*,_false>
  local_1e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d8;
  undefined **local_1c8;
  undefined **local_1c0;
  _Head_base<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_void>_*,_false>
  local_1b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a0;
  _Any_data local_198;
  _Manager_type local_188;
  vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
  local_178;
  shared_ptr<supermap::io::FileManager> local_160;
  shared_ptr<supermap::io::TemporaryFile> local_150;
  element_type *local_140;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_138;
  long *local_130 [2];
  long local_120 [2];
  long *local_110 [2];
  KeyIndexStorage local_100;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
  local_c8;
  string *local_b0;
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>_()>
  *local_a8;
  anon_class_8_1_4c1cc3bf local_a0;
  ulong local_98;
  string local_90;
  _Any_data local_70;
  code *local_60;
  _Any_data local_50;
  code *local_40;
  
  local_268 = local_258;
  local_278 = shrinkBatchSize;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"shrink","");
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,local_268,local_260 + (long)local_268);
  std::__cxx11::string::append((char *)&local_248);
  uVar11 = (local_278 +
           (this->notSortedStorage_).
           super_IndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
           .
           super_OrderedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
           .register_.count_) - 1;
  uVar9 = uVar11 / local_278;
  local_b0 = newIndexFileName;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3ul>,supermap::ByteArray<4ul>>,unsigned_long,void>
  ::
  getCustomDataIterator<supermap::StorageValueIgnorer<supermap::Key<3ul>,supermap::ByteArray<4ul>>>
            ((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3ul>,supermap::ByteArray<4ul>>,unsigned_long,void>
              *)local_110);
  local_178.
  super__Vector_base<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.
  super__Vector_base<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.
  super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.
  super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __n = uVar9 + 1;
  local_98 = uVar9;
  std::
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
  ::reserve(&local_c8,__n);
  std::
  vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
  ::reserve(&local_178,__n);
  exportKeys(&local_100,this,local_278,&local_248);
  local_220._0_8_ =
       local_100.
       super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
       .storageFile_.super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_220._8_8_ =
       local_100.
       super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
       .storageFile_.super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_100.
      super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
      .storageFile_.super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_100.
       super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
       .storageFile_.super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_100.
            super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
            .storageFile_.
            super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_100.
       super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
       .storageFile_.super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_100.
            super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
            .storageFile_.
            super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  std::
  vector<std::shared_ptr<supermap::io::TemporaryFile>,std::allocator<std::shared_ptr<supermap::io::TemporaryFile>>>
  ::emplace_back<std::shared_ptr<supermap::io::TemporaryFile>>
            ((vector<std::shared_ptr<supermap::io::TemporaryFile>,std::allocator<std::shared_ptr<supermap::io::TemporaryFile>>>
              *)&local_178,(shared_ptr<supermap::io::TemporaryFile> *)local_220);
  local_228 = __return_storage_ptr__;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._8_8_);
  }
  local_270 = this;
  std::
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>,supermap::Key<3ul>>,std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>,supermap::Key<3ul>>>>
  ::
  emplace_back<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>,supermap::Key<3ul>>>
            ((vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>,supermap::Key<3ul>>,std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>,supermap::Key<3ul>>>>
              *)&local_c8,&local_100);
  if (local_278 <= uVar11) {
    local_a0.sortedStorageSize =
         (local_270->sortedStorage_).
         super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
         .
         super_IndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
         .
         super_OrderedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
         .register_.count_;
    local_a8 = &local_270->innerRegisterSupplier_;
    uVar9 = 0;
    do {
      local_220._0_8_ = local_220 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_220,local_268,local_260 + (long)local_268);
      std::__cxx11::string::append((char *)local_220);
      cVar12 = '\x01';
      if (9 < uVar9) {
        uVar11 = uVar9;
        cVar8 = '\x04';
        do {
          cVar12 = cVar8;
          if (uVar11 < 100) {
            cVar12 = cVar12 + -2;
            goto LAB_00193331;
          }
          if (uVar11 < 1000) {
            cVar12 = cVar12 + -1;
            goto LAB_00193331;
          }
          if (uVar11 < 10000) goto LAB_00193331;
          bVar6 = 99999 < uVar11;
          uVar11 = uVar11 / 10000;
          cVar8 = cVar12 + '\x04';
        } while (bVar6);
        cVar12 = cVar12 + '\x01';
      }
LAB_00193331:
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_298,cVar12);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_298._M_dataplus._M_p,(uint)local_298._M_string_length,uVar9);
      uVar11 = 0xf;
      if ((element_type *)local_220._0_8_ != (element_type *)(local_220 + 0x10)) {
        uVar11 = local_220._16_8_;
      }
      uVar2 = (long)(_func_int ***)local_220._8_8_ +
              CONCAT44(local_298._M_string_length._4_4_,(uint)local_298._M_string_length);
      if (uVar11 < uVar2) {
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          uVar13 = local_298.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < uVar2) goto LAB_001933ad;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,local_220._0_8_);
      }
      else {
LAB_001933ad:
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)local_220,(ulong)local_298._M_dataplus._M_p);
      }
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      psVar1 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_2b8.field_2._M_allocated_capacity = *psVar1;
        local_2b8.field_2._8_8_ = puVar10[3];
      }
      else {
        local_2b8.field_2._M_allocated_capacity = *psVar1;
        local_2b8._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_2b8._M_string_length = puVar10[1];
      *puVar10 = psVar1;
      puVar10[1] = 0;
      *(undefined1 *)psVar1 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if ((element_type *)local_220._0_8_ != (element_type *)(local_220 + 0x10)) {
        operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
      }
      io::
      InputIterator<supermap::StorageValueIgnorer<supermap::Key<3ul>,supermap::ByteArray<4ul>>,unsigned_long,7ul,void>
      ::
      collectWith<supermap::KeyValueShrinkableStorage<supermap::Key<3ul>,supermap::ByteArray<4ul>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>>::shrink(unsigned_long,std::__cxx11::string_const&)::_lambda(supermap::StorageValueIgnorer<supermap::Key<3ul>,supermap::ByteArray<4ul>>&&,unsigned_long)_1_,supermap::KeyValue<supermap::Key<3ul>,unsigned_long>>
                ((vector<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>_>_>
                  *)&local_298,local_110,local_a0,local_278);
      _Var7._M_p = local_298._M_dataplus._M_p;
      uVar13 = CONCAT44(local_298._M_string_length._4_4_,(uint)local_298._M_string_length);
      local_130[0] = local_120;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_130,local_2b8._M_dataplus._M_p,
                 local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
      peVar4 = (local_270->sortedStorage_).
               super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
               .storageFile_.
               super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_140 = (peVar4->manager_).
                  super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_138 = (peVar4->manager_).
                  super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
      if (local_138 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_138->_M_use_count = local_138->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_138->_M_use_count = local_138->_M_use_count + 1;
        }
      }
      std::
      function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>_()>
      ::function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>_()>
                  *)&local_50,local_a8);
      SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>,supermap::Key<3ul>>
      ::
      SortedSingleFileIndexedStorage<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>>>>,supermap::KeyValueShrinkableStorage<supermap::Key<3ul>,supermap::ByteArray<4ul>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>>::shrink(unsigned_long,std::__cxx11::string_const&)::_lambda(supermap::KeyValue<supermap::Key<3ul>,unsigned_long>const&,supermap::KeyValue<supermap::Key<3ul>,unsigned_long>const&)_1_,supermap::KeyValueShrinkableStorage<supermap::Key<3ul>,supermap::ByteArray<4ul>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>>::shrink(unsigned_long,std::__cxx11::string_const&)::_lambda(supermap::KeyValue<supermap::Key<3ul>,unsigned_long>const&,supermap::KeyValue<supermap::Key<3ul>,unsigned_long>const&)_2_>
                ((SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>,supermap::Key<3ul>>
                  *)local_220,_Var7._M_p,uVar13,0,local_130,&local_140,&local_50);
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      if (local_138 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_138);
      }
      if (local_130[0] != local_120) {
        operator_delete(local_130[0],local_120[0] + 1);
      }
      local_150.super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_200;
      local_150.super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = local_1f8._M_pi;
      if (local_1f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_1f8._M_pi)->_M_use_count = (local_1f8._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_1f8._M_pi)->_M_use_count = (local_1f8._M_pi)->_M_use_count + 1;
        }
      }
      std::
      vector<std::shared_ptr<supermap::io::TemporaryFile>,std::allocator<std::shared_ptr<supermap::io::TemporaryFile>>>
      ::emplace_back<std::shared_ptr<supermap::io::TemporaryFile>>
                ((vector<std::shared_ptr<supermap::io::TemporaryFile>,std::allocator<std::shared_ptr<supermap::io::TemporaryFile>>>
                  *)&local_178,&local_150);
      if (local_150.super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_150.
                   super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>,supermap::Key<3ul>>,std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>,supermap::Key<3ul>>>>
      ::
      emplace_back<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>,supermap::Key<3ul>>>
                ((vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>,supermap::Key<3ul>>,std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>,supermap::Key<3ul>>>>
                  *)&local_c8,
                 (SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
                  *)local_220);
      local_220._0_8_ = &PTR_append_002069c0;
      if (local_1f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f8._M_pi);
      }
      local_220._0_8_ = &PTR___cxa_pure_virtual_00206a38;
      local_220._8_8_ = &PTR_clone_00206a68;
      if (local_208._M_head_impl !=
          (StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
           *)0x0) {
        (**(code **)((long)(local_208._M_head_impl)->
                           super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>
                    + 0x10))();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_298._M_dataplus._M_p,
                        local_298.field_2._M_allocated_capacity - (long)local_298._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < local_98);
  }
  pcVar5 = (local_b0->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar5,pcVar5 + local_b0->_M_string_length);
  this_01 = local_228;
  peVar4 = (local_270->sortedStorage_).
           super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
           .storageFile_.super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_160.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar4->manager_).super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_160.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (peVar4->manager_).
          super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  if (local_160.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_160.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_160.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_160.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_160.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>_()>
  ::function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>_()>
              *)&local_70,&local_270->innerRegisterSupplier_);
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>
  ::SortedSingleFileIndexedStorage
            (this_01,&local_c8,&local_90,&local_160,local_278,(InnerRegisterSupplier *)&local_70);
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  if (local_160.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_160.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_2b8.field_2;
  local_2b8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b8,local_268,local_260 + (long)local_268);
  std::__cxx11::string::append((char *)&local_2b8);
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_298,local_268,local_260 + (long)local_268);
  std::__cxx11::string::append((char *)&local_298);
  this_00 = local_270;
  KeyValueShrinkableStorage
            ((KeyValueShrinkableStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
              *)local_220,local_270,this_01,&local_2b8,&local_298,local_278);
  resetWith(this_00,(KeyValueShrinkableStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
                     *)local_220);
  local_220._0_8_ = &PTR_append_00206ff0;
  if (local_188 != (_Manager_type)0x0) {
    (*local_188)(&local_198,&local_198,__destroy_functor);
  }
  local_1c8 = &PTR_append_002072b0;
  if (local_1a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0._M_pi);
  }
  local_1c8 = &PTR___cxa_pure_virtual_00207130;
  local_1c0 = &PTR_clone_00207160;
  if ((_Tuple_impl<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_void>_*,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_void>_>_>
       )local_1b0._M_head_impl !=
      (StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_void>
       *)0x0) {
    (**(code **)((long)(local_1b0._M_head_impl)->
                       super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_void>_>
                + 0x10))();
  }
  local_1b0._M_head_impl =
       (StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_void>
        *)0x0;
  local_200 = (element_type *)&PTR_append_002072b0;
  if (local_1d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d8._M_pi);
  }
  local_200 = (element_type *)&PTR___cxa_pure_virtual_00207130;
  local_1f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_clone_00207160;
  if (local_1e8._M_head_impl !=
      (StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_void>
       *)0x0) {
    (**(code **)((long)(local_1e8._M_head_impl)->
                       super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_void>_>
                + 0x10))();
  }
  local_1e8._M_head_impl =
       (StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_void>
        *)0x0;
  local_220._0_8_ = &PTR___cxa_pure_virtual_00207130;
  local_220._8_8_ = &PTR_clone_00207160;
  if (local_208._M_head_impl !=
      (StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
       *)0x0) {
    (*((local_208._M_head_impl)->
      super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>
      )._vptr_Cloneable[2])();
  }
  local_208._M_head_impl =
       (StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
        *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  local_2b8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b8,local_268,local_260 + (long)local_268);
  std::__cxx11::string::append((char *)&local_2b8);
  exportKeys((KeyIndexStorage *)local_220,local_270,local_278,&local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  local_2b8._M_dataplus._M_p = (pointer)local_200;
  local_2b8._M_string_length = (size_type)local_1f8._M_pi;
  if (local_1f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1f8._M_pi)->_M_use_count = (local_1f8._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1f8._M_pi)->_M_use_count = (local_1f8._M_pi)->_M_use_count + 1;
    }
  }
  std::
  vector<std::shared_ptr<supermap::io::TemporaryFile>,std::allocator<std::shared_ptr<supermap::io::TemporaryFile>>>
  ::emplace_back<std::shared_ptr<supermap::io::TemporaryFile>>
            ((vector<std::shared_ptr<supermap::io::TemporaryFile>,std::allocator<std::shared_ptr<supermap::io::TemporaryFile>>>
              *)&local_178,(shared_ptr<supermap::io::TemporaryFile> *)&local_2b8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._M_string_length);
  }
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
  ::resetWith(&this_01->
               super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
              ,(SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
                *)local_220);
  local_220._0_8_ = &PTR_append_002069c0;
  if (local_1f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f8._M_pi);
  }
  local_220._0_8_ = &PTR___cxa_pure_virtual_00206a38;
  local_220._8_8_ = &PTR_clone_00206a68;
  if (local_208._M_head_impl !=
      (StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
       *)0x0) {
    (*((local_208._M_head_impl)->
      super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>
      )._vptr_Cloneable[2])();
  }
  local_100.
  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
  .
  super_IndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
  .
  super_OrderedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
  ._vptr_OrderedStorage = (_func_int **)&PTR_append_002069c0;
  if (local_100.
      super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
      .storageFile_.super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.
               super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
               .storageFile_.
               super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_100.
  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
  .
  super_IndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
  .
  super_OrderedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
  ._vptr_OrderedStorage = (_func_int **)&PTR___cxa_pure_virtual_00206a38;
  local_100.
  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
  .
  super_IndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
  .
  super_OrderedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
  .register_.
  super_StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>
  .
  super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>
  ._vptr_Cloneable =
       (Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>
        )&PTR_clone_00206a68;
  if ((_Tuple_impl<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_*,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>
       )local_100.
        super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
        .
        super_IndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
        .
        super_OrderedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
        .register_.innerRegister_._M_t.
        super___uniq_ptr_impl<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_*,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>
        .
        super__Head_base<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_*,_false>
        ._M_head_impl !=
      (StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
       *)0x0) {
    (**(code **)((long)*(Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>
                         *)local_100.
                           super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
                           .
                           super_IndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
                           .
                           super_OrderedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
                           .register_.innerRegister_._M_t.
                           super___uniq_ptr_impl<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_*,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>
                           .
                           super__Head_base<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_*,_false>
                           ._M_head_impl + 0x10))();
  }
  std::
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>,_supermap::Key<3UL>_>_>_>
  ::~vector(&local_c8);
  std::
  vector<std::shared_ptr<supermap::io::TemporaryFile>,_std::allocator<std::shared_ptr<supermap::io::TemporaryFile>_>_>
  ::~vector(&local_178);
  if (local_110[0] != (long *)0x0) {
    (**(code **)(*local_110[0] + 0x18))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if (local_268 != local_258) {
    operator_delete(local_268,local_258[0] + 1);
  }
  return this_01;
}

Assistant:

[[nodiscard]] KeyIndexStorage shrink(IndexT shrinkBatchSize, const std::string &newIndexFileName) {

        const std::string shrinkFilenamePrefix = "shrink";
        const std::string tempSortedIndexFilename = shrinkFilenamePrefix + "-sorted-keys";

        std::size_t batchesCount = (notSortedStorage_.getItemsCount() + shrinkBatchSize - 1) / shrinkBatchSize;
        auto notSortedKeysStream = getNotSortedKeys();
        std::vector<std::shared_ptr<io::TemporaryFile>> tempFilesLock;
        std::vector<KeyIndexStorage> sortedBatches;
        sortedBatches.reserve(batchesCount + 1);
        tempFilesLock.reserve(batchesCount + 1);

        KeyIndexStorage exportedKeys = exportKeys(shrinkBatchSize, tempSortedIndexFilename);
        tempFilesLock.push_back(exportedKeys.shareStorageFile());

        sortedBatches.push_back(std::move(exportedKeys));
        IndexT sortedStorageSize = sortedStorage_.getItemsCount();
        for (std::size_t batchI = 0; batchI < batchesCount; ++batchI) {
            const std::string batchFileName = shrinkFilenamePrefix + "-batch-" + std::to_string(batchI);
            std::vector<KeyIndex> notSortedKeys = notSortedKeysStream.collectWith(
                [sortedStorageSize](ValueIgnorer &&svi, IndexT index) {
                    return KeyIndex{std::move(svi.key), index + sortedStorageSize};
                },
                shrinkBatchSize
            );
            KeyIndexStorage sortedBatch(
                notSortedKeys.begin(),
                notSortedKeys.end(),
                false,
                batchFileName,
                getFileManager(),
                [](const KeyIndex &a, const KeyIndex &b) { return a.key < b.key; },
                [](const KeyIndex &a, const KeyIndex &b) { return a.key == b.key; },
                innerRegisterSupplier_
            );
            tempFilesLock.push_back(sortedBatch.shareStorageFile());
            assert(sortedBatch.getItemsCount() > 0 && "Batch file can not be empty");
            sortedBatches.push_back(std::move(sortedBatch));
        }

        KeyIndexStorage updatedIndex(
            sortedBatches,
            newIndexFileName,
            getFileManager(),
            shrinkBatchSize,
            innerRegisterSupplier_
        );

        resetWith(KeyValueShrinkableStorage(
            *this,
            updatedIndex,
            shrinkFilenamePrefix + "-new-not-sorted",
            shrinkFilenamePrefix + "-new-sorted",
            shrinkBatchSize
        ));

        KeyIndexStorage actualExportedKeys
            = exportKeys(shrinkBatchSize, shrinkFilenamePrefix + "-actual-index");
        tempFilesLock.push_back(actualExportedKeys.shareStorageFile());
        updatedIndex.resetWith(std::move(actualExportedKeys));
        return updatedIndex;
    }